

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlGetObjectListNextItem
                    (JlDataObject *ListObject,JlDataObject **pNextObject,JlListItem **pEnumerator)

{
  JL_STATUS local_24;
  JL_STATUS jlStatus;
  JlListItem **pEnumerator_local;
  JlDataObject **pNextObject_local;
  JlDataObject *ListObject_local;
  
  if (((ListObject == (JlDataObject *)0x0) || (pNextObject == (JlDataObject **)0x0)) ||
     (pEnumerator == (JlListItem **)0x0)) {
    local_24 = JL_STATUS_INVALID_PARAMETER;
  }
  else if ((ListObject->Type == JL_DATA_TYPE_LIST) &&
          ((*pEnumerator == (JlListItem *)0x0 ||
           ((*pEnumerator)->ParentList == (JlList *)&ListObject->field_2)))) {
    if (*pEnumerator == (JlListItem *)0x0) {
      *pEnumerator = (JlListItem *)(ListObject->field_2).Number.field_1;
      if ((ListObject->field_2).List.ListHead == (JlListItem *)0x0) {
        *pNextObject = (JlDataObject *)0x0;
        local_24 = JL_STATUS_END_OF_DATA;
      }
      else {
        *pNextObject = ((ListObject->field_2).List.ListHead)->Object;
        local_24 = JL_STATUS_SUCCESS;
      }
    }
    else {
      *pEnumerator = (*pEnumerator)->Next;
      if (*pEnumerator == (JlListItem *)0x0) {
        *pNextObject = (JlDataObject *)0x0;
        local_24 = JL_STATUS_END_OF_DATA;
      }
      else {
        *pNextObject = (*pEnumerator)->Object;
        local_24 = JL_STATUS_SUCCESS;
      }
    }
  }
  else {
    local_24 = JL_STATUS_WRONG_TYPE;
  }
  return local_24;
}

Assistant:

JL_STATUS
    JlGetObjectListNextItem
    (
        JlDataObject const*     ListObject,
        JlDataObject**          pNextObject,
        JlListItem**            pEnumerator
    )
{
    JL_STATUS jlStatus;

    if(     NULL != ListObject
        &&  NULL != pNextObject
        &&  NULL != pEnumerator )
    {
        if(     JL_DATA_TYPE_LIST == ListObject->Type
            &&  ( NULL == *pEnumerator  || (*pEnumerator)->ParentList == &ListObject->List ) )
        {
            if( NULL == *pEnumerator )
            {
                *pEnumerator = ListObject->List.ListHead;
                if( NULL != ListObject->List.ListHead )
                {
                    *pNextObject = ListObject->List.ListHead->Object;
                    jlStatus = JL_STATUS_SUCCESS;
                }
                else
                {
                    *pNextObject = NULL;
                    jlStatus = JL_STATUS_END_OF_DATA;
                }
            }
            else
            {
                *pEnumerator = (*pEnumerator)->Next;
                if( NULL != *pEnumerator )
                {
                    *pNextObject = (*pEnumerator)->Object;
                    jlStatus = JL_STATUS_SUCCESS;
                }
                else
                {
                    *pNextObject = NULL;
                    jlStatus = JL_STATUS_END_OF_DATA;
                }
            }
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}